

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

symbol * Symbol_new(char *x)

{
  symbol *data;
  char *key;
  ushort **ppuVar1;
  
  data = Symbol_find(x);
  if (data == (symbol *)0x0) {
    data = (symbol *)calloc(1,0x60);
    if (data == (symbol *)0x0) {
      memory_error();
    }
    key = Strsafe(x);
    data->name = key;
    ppuVar1 = __ctype_b_loc();
    data->type = (uint)(((*ppuVar1)[(byte)*x] >> 8 & 1) == 0);
    data->prec = -1;
    data->assoc = UNK;
    Symbol_insert(data,key);
  }
  data->useCnt = data->useCnt + 1;
  return data;
}

Assistant:

struct symbol *Symbol_new(const char *x)
{
  struct symbol *sp;

  sp = Symbol_find(x);
  if( sp==0 ){
    sp = (struct symbol *)calloc(1, sizeof(struct symbol) );
    MemoryCheck(sp);
    sp->name = Strsafe(x);
    sp->type = ISUPPER(*x) ? TERMINAL : NONTERMINAL;
    sp->rule = 0;
    sp->fallback = 0;
    sp->prec = -1;
    sp->assoc = UNK;
    sp->firstset = 0;
    sp->lambda = LEMON_FALSE;
    sp->destructor = 0;
	sp->destLineno = 0;
    sp->datatype = 0;
	sp->useCnt = 0;
    Symbol_insert(sp,sp->name);
  }
  sp->useCnt++;
  return sp;
}